

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall ChainstateManager::IsSnapshotActive(ChainstateManager *this)

{
  pointer pCVar1;
  bool bVar2;
  pointer pCVar3;
  char *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock57;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffdb;
  int in_stack_ffffffffffffffdc;
  char *pszFile;
  char *in_stack_ffffffffffffffe8;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffff0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *this_00;
  
  this_00 = *(UniqueLock<AnnotatedMixin<std::recursive_mutex>_> **)(in_FS_OFFSET + 0x28);
  pszFile = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffffb8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,pszFile,
             in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                     in_stack_ffffffffffffffb8);
  bVar4 = false;
  if (bVar2) {
    pCVar1 = *(pointer *)(in_RDI + 0x10);
    pCVar3 = std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::get
                       ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                        in_stack_ffffffffffffffb8);
    bVar4 = pCVar1 == pCVar3;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffffb8);
  if (*(UniqueLock<AnnotatedMixin<std::recursive_mutex>_> **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool ChainstateManager::IsSnapshotActive() const
{
    LOCK(::cs_main);
    return m_snapshot_chainstate && m_active_chainstate == m_snapshot_chainstate.get();
}